

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void loop_through_half_edges_inside_a_face(Mesh *new_mesh)

{
  Face *input_face;
  pointer ppFVar1;
  pointer ppFVar2;
  ostream *poVar3;
  HalfEdge *pHVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_> local_50;
  ulong local_38;
  
  uVar6 = 0;
  while( true ) {
    std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::vector
              (&local_50,&new_mesh->all_faces);
    ppFVar2 = local_50.super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppFVar1 = local_50.super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_50.super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    uVar7 = (ulong)uVar6;
    if ((ulong)((long)ppFVar2 - (long)ppFVar1 >> 3) <= uVar7) break;
    std::vector<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>::vector
              (&local_50,&new_mesh->all_faces);
    if ((ulong)((long)local_50.
                      super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_50.
                      super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar7) {
      uVar5 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar7);
      if (local_50.super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.
                        super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar5);
    }
    input_face = local_50.super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7];
    if (local_50.super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<HalfMesh::Face_*,_std::allocator<HalfMesh::Face_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"One half edge for face F: ",0x1a);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," HE : ",6);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pHVar4 = HalfMesh::Mesh::get_half_edge(new_mesh,input_face->one_half_edge->half_edge_handle);
    pHVar4 = HalfMesh::Mesh::get_next_half_edge(new_mesh,pHVar4,input_face);
    pHVar4 = HalfMesh::Mesh::get_half_edge(new_mesh,pHVar4->half_edge_handle);
    pHVar4 = HalfMesh::Mesh::get_next_half_edge(new_mesh,pHVar4,input_face);
    pHVar4 = HalfMesh::Mesh::get_half_edge(new_mesh,pHVar4->half_edge_handle);
    pHVar4 = HalfMesh::Mesh::get_next_half_edge(new_mesh,pHVar4,input_face);
    local_38 = (ulong)pHVar4->half_edge_handle;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"->",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"->",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"->",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void loop_through_half_edges_inside_a_face(HalfMesh::Mesh *new_mesh) {
    for (unsigned int i = 0; i < new_mesh->get_faces().size(); ++i) {
        HalfMesh::Face *new_face = new_mesh->get_faces().at(i);
        std::cout << "One half edge for face F: " << new_face->handle() << " HE : "
                  << new_face->get_one_half_edge()->handle() << std::endl;
        unsigned int he_1, he_2, he_3, he_4;
        he_1 = new_face->get_one_half_edge()->handle();
        he_2 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_1), new_face)->handle();
        he_3 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_2), new_face)->handle();
        he_4 = new_mesh->get_next_half_edge(new_mesh->get_half_edge(he_3), new_face)->handle();
        std::cout << he_1 << "->" << he_2 << "->" << he_3 << "->" << he_4 << std::endl;
    }
}